

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O0

void __thiscall PresolveComponentData::clear(PresolveComponentData *this)

{
  HighsLp *in_RDI;
  HighsPostsolveStack *in_stack_ffffffffffffff08;
  undefined1 local_e8 [232];
  
  *(undefined1 *)
   &(in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  memset(local_e8,0,0xe0);
  presolve::HighsPostsolveStack::HighsPostsolveStack((HighsPostsolveStack *)in_RDI);
  presolve::HighsPostsolveStack::operator=((HighsPostsolveStack *)in_RDI,in_stack_ffffffffffffff08);
  presolve::HighsPostsolveStack::~HighsPostsolveStack((HighsPostsolveStack *)in_RDI);
  HighsLp::clear(in_RDI);
  HighsSolution::clear((HighsSolution *)in_RDI);
  HighsBasis::clear((HighsBasis *)in_RDI);
  return;
}

Assistant:

void clear() {
    is_valid = false;

    postSolveStack = presolve::HighsPostsolveStack();

    reduced_lp_.clear();
    recovered_solution_.clear();
    recovered_basis_.clear();
  }